

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  DescriptorPool *pDVar4;
  Data *pDVar5;
  MessageFactory *pMVar6;
  undefined4 extraout_var;
  LogMessage *other;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  undefined4 local_cc;
  ZeroCopyCodedInputStream *local_c8 [3];
  undefined1 local_b0 [8];
  ParseContext ctx;
  char *ptr;
  ZeroCopyCodedInputStream zcis;
  ParseFlags parse_flags_local;
  CodedInputStream *input_local;
  MessageLite *this_local;
  
  zcis.cis_._4_4_ = parse_flags;
  ZeroCopyCodedInputStream::ZeroCopyCodedInputStream((ZeroCopyCodedInputStream *)&ptr,input);
  iVar2 = io::CodedInputStream::RecursionBudget(input);
  bVar1 = ZeroCopyCodedInputStream::aliasing_enabled((ZeroCopyCodedInputStream *)&ptr);
  local_c8[0] = (ZeroCopyCodedInputStream *)&ptr;
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            ((ParseContext *)local_b0,iVar2,bVar1,(char **)&ctx.data_.factory,local_c8);
  internal::ParseContext::TrackCorrectEnding((ParseContext *)local_b0);
  pDVar4 = io::CodedInputStream::GetExtensionPool(input);
  pDVar5 = internal::ParseContext::data((ParseContext *)local_b0);
  pDVar5->pool = pDVar4;
  pMVar6 = io::CodedInputStream::GetExtensionFactory(input);
  pDVar5 = internal::ParseContext::data((ParseContext *)local_b0);
  pDVar5->factory = pMVar6;
  iVar2 = (*this->_vptr_MessageLite[0xb])(this,ctx.data_.factory,local_b0);
  ctx.data_.factory = (MessageFactory *)CONCAT44(extraout_var,iVar2);
  if (ctx.data_.factory == (MessageFactory *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    internal::EpsCopyInputStream::BackUp((EpsCopyInputStream *)local_b0,(char *)ctx.data_.factory);
    bVar1 = internal::EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)local_b0);
    if (bVar1) {
      io::CodedInputStream::SetConsumed(input);
    }
    else {
      local_109 = 0;
      uVar3 = internal::EpsCopyInputStream::LastTag((EpsCopyInputStream *)local_b0);
      if (uVar3 == 1) {
        internal::LogMessage::LogMessage
                  (&local_108,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0xf0);
        local_109 = 1;
        other = internal::LogMessage::operator<<(&local_108,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=(&local_10a,other);
      }
      if ((local_109 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_108);
      }
      bVar1 = internal::EpsCopyInputStream::IsExceedingLimit
                        ((EpsCopyInputStream *)local_b0,(char *)ctx.data_.factory);
      if (bVar1) {
        this_local._7_1_ = false;
        goto LAB_00283e36;
      }
      uVar3 = internal::EpsCopyInputStream::LastTag((EpsCopyInputStream *)local_b0);
      io::CodedInputStream::SetLastTag(input,uVar3);
    }
    this_local._7_1_ =
         anon_unknown_18::CheckFieldPresence((ParseContext *)local_b0,this,zcis.cis_._4_4_);
  }
LAB_00283e36:
  local_cc = 1;
  ZeroCopyCodedInputStream::~ZeroCopyCodedInputStream((ZeroCopyCodedInputStream *)&ptr);
  return this_local._7_1_;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}